

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O3

void GD::save_load_regressor<sparse_parameters>
               (vw *all,io_buf *model_file,bool read,bool text,sparse_parameters *weights)

{
  float fVar1;
  float *data;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  size_t sVar5;
  size_t sVar6;
  vw_exception *this;
  byte bVar7;
  uint uVar8;
  key_type *data_00;
  _Hash_node_base *p_Var9;
  uint64_t i;
  uint32_t old_i;
  uint64_t index_1;
  stringstream msg;
  key_type local_200;
  undefined1 local_1f4 [4];
  ulong local_1f0;
  float *local_1e8;
  vw *local_1e0;
  string local_1d8;
  ulong local_1b8;
  float *local_1b0;
  undefined1 local_1a8 [376];
  
  if (all->print_invert == true) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    for (p_Var4 = (all->name_index_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(all->name_index_map)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      local_200 = *(long *)(p_Var4 + 2) << ((byte)weights->_stride_shift & 0x3f) &
                  weights->_weight_mask;
      _Var2._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)weights,&local_200);
      if (_Var2._M_cur == (__node_type *)0x0) {
        local_1e8 = calloc_or_throw<float>(1L << ((byte)weights->_stride_shift & 0x3f));
        local_1f0 = local_200;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,float*>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)weights,&local_1f0);
        _Var2._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)weights,&local_200);
        if (weights->fun != (_func_void_weight_ptr_void_ptr *)0x0) {
          (*weights->fun)(*(weight **)((long)_Var2._M_cur + 0x10),weights->default_data);
        }
      }
      data = *(float **)
              ((long)&((_Var2._M_cur)->
                      super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                      super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                      _M_storage._M_storage + 8);
      if ((*data != 0.0) || (NAN(*data))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
        bin_text_write_fixed(model_file,*(char **)(p_Var4 + 1),1,(stringstream *)&local_1b8,true);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
        poVar3 = std::ostream::_M_insert<double>((double)*data);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        bin_text_write_fixed(model_file,(char *)data,4,(stringstream *)&local_1b8,true);
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  else {
    local_200 = 0;
    local_1f4 = (undefined1  [4])0x0;
    uVar8 = all->num_bits;
    bVar7 = (byte)uVar8;
    local_1e0 = all;
    if (read) {
      while( true ) {
        if (uVar8 < 0x1f) {
          sVar5 = io_buf::bin_read_fixed(model_file,local_1f4,4,"");
          local_200 = (key_type)(uint)local_1f4;
        }
        else {
          sVar5 = io_buf::bin_read_fixed(model_file,(char *)&local_200,8,"");
        }
        if (sVar5 == 0) break;
        if ((ulong)(1L << (bVar7 & 0x3f)) <= local_200) {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Model content is corrupted, weight vector index ",0x30);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3," must be less than total vector length ",0x27);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          this = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd.cc"
                     ,0x2da,&local_1d8);
          __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        local_1f0 = local_200 << ((byte)weights->_stride_shift & 0x3f) & weights->_weight_mask;
        _Var2._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)weights,&local_1f0);
        if (_Var2._M_cur == (__node_type *)0x0) {
          local_1b0 = calloc_or_throw<float>(1L << ((byte)weights->_stride_shift & 0x3f));
          local_1b8 = local_1f0;
          std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_long,float*>>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)weights,&local_1b8);
          _Var2._M_cur = (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)weights,&local_1f0);
          if (weights->fun != (_func_void_weight_ptr_void_ptr *)0x0) {
            (*weights->fun)(*(weight **)((long)_Var2._M_cur + 0x10),weights->default_data);
          }
        }
        sVar6 = io_buf::bin_read_fixed
                          (model_file,
                           *(char **)((long)&((_Var2._M_cur)->
                                             super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                             ).
                                             super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                             ._M_storage._M_storage + 8),4,"");
        if (sVar5 + sVar6 == 0) {
          return;
        }
        uVar8 = local_1e0->num_bits;
      }
    }
    else {
      p_Var9 = (weights->_map)._M_h._M_before_begin._M_nxt;
      if (p_Var9 != (_Hash_node_base *)0x0) {
        do {
          fVar1 = *(float *)&(p_Var9[2]._M_nxt)->_M_nxt;
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            local_200 = (ulong)p_Var9[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f);
            std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            sVar5 = 8;
            data_00 = &local_200;
            if (local_1e0->num_bits < 0x1f) {
              local_1f4 = (undefined1  [4])(uint)local_200;
              sVar5 = 4;
              data_00 = (key_type *)local_1f4;
            }
            bin_text_write_fixed(model_file,(char *)data_00,sVar5,(stringstream *)&local_1b8,text);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            poVar3 = std::ostream::_M_insert<double>((double)*(float *)&(p_Var9[2]._M_nxt)->_M_nxt);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
            bin_text_write_fixed
                      (model_file,(char *)p_Var9[2]._M_nxt,4,(stringstream *)&local_1b8,text);
            std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          }
          p_Var9 = p_Var9->_M_nxt;
        } while (p_Var9 != (_Hash_node_base *)0x0);
      }
    }
  }
  return;
}

Assistant:

void save_load_regressor(vw& all, io_buf& model_file, bool read, bool text, T& weights)
{
  size_t brw = 1;

  if (all.print_invert)  // write readable model with feature names
  {
    stringstream msg;
    typedef std::map<std::string, size_t> str_int_map;

    for (str_int_map::iterator it = all.name_index_map.begin(); it != all.name_index_map.end(); ++it)
    {
      weight* v = &weights.strided_index(it->second);
      if (*v != 0.)
      {
        msg << it->first;
        brw = bin_text_write_fixed(model_file, (char*)it->first.c_str(), sizeof(*it->first.c_str()), msg, true);

        msg << ":" << it->second << ":" << *v << "\n";
        bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, true);
      }
    }
    return;
  }

  uint64_t i = 0;
  uint32_t old_i = 0;
  uint64_t length = (uint64_t)1 << all.num_bits;
  if (read)
    do
    {
      brw = 1;
      if (all.num_bits < 31)  // backwards compatible
      {
        brw = model_file.bin_read_fixed((char*)&old_i, sizeof(old_i), "");
        i = old_i;
      }
      else
        brw = model_file.bin_read_fixed((char*)&i, sizeof(i), "");
      if (brw > 0)
      {
        if (i >= length)
          THROW("Model content is corrupted, weight vector index " << i << " must be less than total vector length "
                                                                   << length);
        weight* v = &weights.strided_index(i);
        brw += model_file.bin_read_fixed((char*)&(*v), sizeof(*v), "");
      }
    } while (brw > 0);
  else  // write
    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if (*v != 0.)
      {
        i = v.index() >> weights.stride_shift();
        stringstream msg;
        msg << i;

        if (all.num_bits < 31)
        {
          old_i = (uint32_t)i;
          brw = bin_text_write_fixed(model_file, (char*)&old_i, sizeof(old_i), msg, text);
        }
        else
          brw = bin_text_write_fixed(model_file, (char*)&i, sizeof(i), msg, text);

        msg << ":" << *v << "\n";
        brw += bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, text);
      }
}